

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3VdbeMemCast(Mem *pMem,u8 aff,u8 encoding)

{
  ushort uVar1;
  i64 iVar2;
  double dVar3;
  
  uVar1 = pMem->flags;
  if ((uVar1 & 1) == 0) {
    switch(aff) {
    case 'A':
      if ((uVar1 & 0x10) == 0) {
        applyAffinity(pMem,'B',encoding);
        if ((pMem->flags & 2) == 0) {
          return;
        }
        uVar1 = pMem->flags & 0x3e00 | 0x10;
      }
      else {
        uVar1 = uVar1 & 0x3e10;
      }
      break;
    default:
      pMem->flags = uVar1 >> 3 & 2 | uVar1;
      applyAffinity(pMem,'B',encoding);
      pMem->flags = pMem->flags & 0xbfe3;
      return;
    case 'C':
      sqlite3VdbeMemNumerify(pMem);
      return;
    case 'D':
      iVar2 = sqlite3VdbeIntValue(pMem);
      (pMem->u).i = iVar2;
      uVar1 = pMem->flags & 0x3e00 | 4;
      break;
    case 'E':
      dVar3 = sqlite3VdbeRealValue(pMem);
      (pMem->u).r = dVar3;
      uVar1 = pMem->flags & 0x3e00 | 8;
    }
    pMem->flags = uVar1;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3VdbeMemCast(Mem *pMem, u8 aff, u8 encoding){
  if( pMem->flags & MEM_Null ) return;
  switch( aff ){
    case SQLITE_AFF_BLOB: {   /* Really a cast to BLOB */
      if( (pMem->flags & MEM_Blob)==0 ){
        sqlite3ValueApplyAffinity(pMem, SQLITE_AFF_TEXT, encoding);
        assert( pMem->flags & MEM_Str || pMem->db->mallocFailed );
        if( pMem->flags & MEM_Str ) MemSetTypeFlag(pMem, MEM_Blob);
      }else{
        pMem->flags &= ~(MEM_TypeMask&~MEM_Blob);
      }
      break;
    }
    case SQLITE_AFF_NUMERIC: {
      sqlite3VdbeMemNumerify(pMem);
      break;
    }
    case SQLITE_AFF_INTEGER: {
      sqlite3VdbeMemIntegerify(pMem);
      break;
    }
    case SQLITE_AFF_REAL: {
      sqlite3VdbeMemRealify(pMem);
      break;
    }
    default: {
      assert( aff==SQLITE_AFF_TEXT );
      assert( MEM_Str==(MEM_Blob>>3) );
      pMem->flags |= (pMem->flags&MEM_Blob)>>3;
      sqlite3ValueApplyAffinity(pMem, SQLITE_AFF_TEXT, encoding);
      assert( pMem->flags & MEM_Str || pMem->db->mallocFailed );
      pMem->flags &= ~(MEM_Int|MEM_Real|MEM_Blob|MEM_Zero);
      break;
    }
  }
}